

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O2

bool __thiscall CEditor::PopupSelectImage(CEditor *this,void *pContext,CUIRect View)

{
  undefined4 uVar1;
  long lVar2;
  CEditorImage **ppCVar3;
  CEditorImage *pCVar4;
  undefined4 uVar5;
  uint uVar6;
  bool bVar7;
  int iVar8;
  byte bVar9;
  char *pText;
  long lVar10;
  int *pID;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long in_FS_OFFSET;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  CUIRect Button;
  CUIRect local_68;
  CUIRect ButtonBar;
  CUIRect View_local;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  View_local = View;
  CUIRect::VSplitLeft(&View_local,80.0,&ButtonBar,&View_local);
  CUIRect::Margin(&View_local,10.0,&local_68);
  lVar10 = -8;
  bVar9 = 0;
  lVar13 = -1;
  uVar11 = g_SelectImageCurrent;
  while (iVar8 = (this->m_Map).m_lImages.num_elements, lVar13 < iVar8) {
    CUIRect::HSplitTop(&ButtonBar,12.0,&Button,&ButtonBar);
    CUIRect::HSplitTop(&ButtonBar,2.0,(CUIRect *)0x0,&ButtonBar);
    bVar7 = CUI::MouseInside(&this->m_UI,&Button);
    uVar12 = (uint)lVar13;
    uVar6 = uVar12;
    if (!bVar7) {
      uVar6 = uVar11;
    }
    uVar11 = uVar6;
    pID = &PopupSelectImage::s_NoImageButton;
    pText = "None";
    if (lVar13 + 1 != 0) {
      ppCVar3 = (this->m_Map).m_lImages.list;
      pID = (int *)((long)ppCVar3 + lVar10);
      pText = ppCVar3[lVar13]->m_aName;
    }
    iVar8 = DoButton_MenuItem(this,pID,pText,(uint)(uVar12 == g_SelectImageCurrent),&Button,0,
                              (char *)0x0);
    if (iVar8 != 0) {
      g_SelectImageSelected = uVar12;
      iVar8 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[0xb])();
      bVar9 = bVar9 | (byte)iVar8;
    }
    lVar10 = lVar10 + 8;
    lVar13 = lVar13 + 1;
  }
  if (-1 < (int)uVar11 && (int)uVar11 < iVar8) {
    if (local_68.w <= local_68.h) {
      local_68.h = local_68.w;
    }
    pCVar4 = (this->m_Map).m_lImages.list[uVar11];
    uVar1 = (pCVar4->super_CImageInfo).m_Width;
    uVar5 = (pCVar4->super_CImageInfo).m_Height;
    iVar8 = uVar5;
    if ((int)uVar5 < (int)uVar1) {
      iVar8 = uVar1;
    }
    auVar15._0_4_ = (float)(int)uVar1;
    auVar15._4_4_ = (float)(int)uVar5;
    auVar15._8_8_ = 0;
    auVar16._4_4_ = (float)iVar8;
    auVar16._0_4_ = (float)iVar8;
    auVar16._8_4_ = uVar5;
    auVar16._12_4_ = uVar5;
    auVar16 = divps(auVar15,auVar16);
    fVar14 = local_68.h * auVar16._0_4_;
    local_68.h = local_68.h * auVar16._4_4_;
    local_68.w = fVar14;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
              (this->m_pGraphics,(ulong)(uint)(pCVar4->m_Texture).m_Id);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0xb])();
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
    Button.x = local_68.x;
    Button.y = local_68.y;
    Button.w = local_68.w;
    Button.h = local_68.h;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&Button,1);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[10])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (bool)(bVar9 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CEditor::PopupSelectImage(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CUIRect ButtonBar, ImageView;
	View.VSplitLeft(80.0f, &ButtonBar, &View);
	View.Margin(10.0f, &ImageView);

	int ShowImage = g_SelectImageCurrent;
	bool ClosePopup = false;

	static int s_NoImageButton;
	for(int i = -1; i < pEditor->m_Map.m_lImages.size(); i++)
	{
		CUIRect Button;
		ButtonBar.HSplitTop(12.0f, &Button, &ButtonBar);
		ButtonBar.HSplitTop(2.0f, 0, &ButtonBar);

		if(pEditor->UI()->MouseInside(&Button))
			ShowImage = i;

		if(pEditor->DoButton_MenuItem(i == -1 ? (void *)&s_NoImageButton : &pEditor->m_Map.m_lImages[i], i == -1 ? "None" : pEditor->m_Map.m_lImages[i]->m_aName, i == g_SelectImageCurrent, &Button))
		{
			g_SelectImageSelected = i;
			ClosePopup |= pEditor->Input()->MouseDoubleClick();
		}
	}

	if(ShowImage >= 0 && ShowImage < pEditor->m_Map.m_lImages.size())
	{
		if(ImageView.h < ImageView.w)
			ImageView.w = ImageView.h;
		else
			ImageView.h = ImageView.w;
		float Max = (float)(maximum(pEditor->m_Map.m_lImages[ShowImage]->m_Width, pEditor->m_Map.m_lImages[ShowImage]->m_Height));
		ImageView.w *= pEditor->m_Map.m_lImages[ShowImage]->m_Width/Max;
		ImageView.h *= pEditor->m_Map.m_lImages[ShowImage]->m_Height/Max;
		pEditor->Graphics()->TextureSet(pEditor->m_Map.m_lImages[ShowImage]->m_Texture);
		pEditor->Graphics()->BlendNormal();
		pEditor->Graphics()->WrapClamp();
		pEditor->Graphics()->QuadsBegin();
		IGraphics::CQuadItem QuadItem(ImageView.x, ImageView.y, ImageView.w, ImageView.h);
		pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);
		pEditor->Graphics()->QuadsEnd();
		pEditor->Graphics()->WrapNormal();
	}

	return ClosePopup;
}